

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O1

int __thiscall
FVoxelTexture::CopyTrueColorPixels
          (FVoxelTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  byte *pbVar1;
  long lVar2;
  BYTE bitmap [256];
  PalEntry pe [256];
  
  pbVar1 = this->SourceVox->Palette;
  if (pbVar1 == (byte *)0x0) {
    lVar2 = 0;
    do {
      bitmap[lVar2] = (BYTE)lVar2;
      pe[lVar2].field_0 = GPalette.BaseColors[lVar2].field_0;
      pe[lVar2].field_0.field_0.a = 0xff;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
  }
  else {
    lVar2 = 0;
    do {
      bitmap[lVar2] = (BYTE)lVar2;
      pe[lVar2].field_0.field_0.r = *pbVar1 >> 4 | *pbVar1 * '\x04';
      pe[lVar2].field_0.field_0.g = pbVar1[1] >> 4 | pbVar1[1] * '\x04';
      pe[lVar2].field_0.field_0.b = pbVar1[2] >> 4 | pbVar1[2] * '\x04';
      pe[lVar2].field_0.field_0.a = 0xff;
      lVar2 = lVar2 + 1;
      pbVar1 = pbVar1 + 3;
    } while (lVar2 != 0x100);
  }
  (*bmp->_vptr_FBitmap[3])
            (bmp,(ulong)(uint)x,(ulong)(uint)y,bitmap,(ulong)(this->super_FTexture).Width,
             (ulong)(this->super_FTexture).Height,1,0x10,rotate,pe,inf);
  return 0;
}

Assistant:

int FVoxelTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	PalEntry pe[256];
	BYTE bitmap[256];
	BYTE *pp = SourceVox->Palette;

	if(pp != NULL)
	{
		for(int i=0;i<256;i++, pp+=3)
		{
			bitmap[i] = (BYTE)i;
			pe[i].r = (pp[0] << 2) | (pp[0] >> 4);
			pe[i].g = (pp[1] << 2) | (pp[1] >> 4);
			pe[i].b = (pp[2] << 2) | (pp[2] >> 4);
			pe[i].a = 255;
		}
	}
	else 
	{
		for(int i=0;i<256;i++, pp+=3)
		{
			bitmap[i] = (BYTE)i;
			pe[i] = GPalette.BaseColors[i];
			pe[i].a = 255;
		}
	}    
	bmp->CopyPixelData(x, y, bitmap, Width, Height, 1, 16, rotate, pe, inf);
	return 0;
}